

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cc
# Opt level: O2

void wabt::WriteDoubleHex(char *buffer,size_t size,uint64_t bits)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  char *pcVar6;
  byte *pbVar7;
  ulong uVar8;
  size_t __n;
  char buffer_1 [40];
  
  pcVar6 = buffer_1;
  uVar3 = (uint)(bits >> 0x34) & 0x7ff;
  uVar2 = uVar3 - 0x3ff;
  if ((long)bits < 0) {
    pcVar6 = buffer_1 + 1;
    buffer_1[0] = '-';
  }
  uVar4 = bits & 0xfffffffffffff;
  if (uVar2 == 0x400) {
    pbVar7 = (byte *)(pcVar6 + 3);
    if (uVar4 == 0) {
      builtin_strncpy(pcVar6,"inf",4);
    }
    else {
      builtin_strncpy(pcVar6,"nan",4);
      if (uVar4 != 0x8000000000000) {
        pbVar7[0] = 0x3a;
        pbVar7[1] = 0x30;
        pbVar7[2] = 0x78;
        pbVar7[3] = 0;
        iVar1 = -0x10;
        for (; uVar4 >> 0x3c == 0; uVar4 = uVar4 << 4) {
          iVar1 = iVar1 + 1;
        }
        pbVar7 = (byte *)(pcVar6 + 6);
        for (; iVar1 != 0; iVar1 = iVar1 + 1) {
          *pbVar7 = "0123456789abcdef"[uVar4 >> 0x3c];
          pbVar7 = pbVar7 + 1;
          uVar4 = uVar4 << 4;
        }
      }
    }
    goto LAB_00136c18;
  }
  pcVar6[0] = '0';
  pcVar6[1] = 'x';
  pcVar6[2] = (uVar3 == 0 && uVar4 == 0) ^ 0x31;
  if (uVar4 == 0) {
    pcVar6 = pcVar6 + 3;
  }
  else {
    uVar5 = uVar4 << 0xc;
    if (uVar3 == 0) {
      uVar8 = 0x3f;
      if (uVar4 != 0) {
        for (; uVar5 >> uVar8 == 0; uVar8 = uVar8 - 1) {
        }
      }
      uVar8 = uVar8 ^ 0x3f;
      uVar5 = uVar5 << ((char)uVar8 + 1U & 0x3f);
      if (uVar8 == 0x3f) {
        uVar5 = 0;
      }
      uVar2 = -(int)uVar8 - 0x3ff;
    }
    pcVar6[3] = '.';
    pcVar6 = pcVar6 + 4;
    for (; uVar5 != 0; uVar5 = uVar5 << 4) {
      *pcVar6 = "0123456789abcdef"[uVar5 >> 0x3c];
      pcVar6 = pcVar6 + 1;
    }
  }
  *pcVar6 = 'p';
  if (uVar3 == 0 && uVar4 == 0) {
    pcVar6[3] = '\0';
    pcVar6[1] = '+';
    pcVar6[2] = '0';
    pbVar7 = (byte *)(pcVar6 + 3);
    goto LAB_00136c18;
  }
  uVar3 = -uVar2;
  if (0 < (int)uVar2) {
    uVar3 = uVar2;
  }
  pcVar6[1] = (char)((int)uVar2 >> 0x1f) * -2 + '+';
  if (uVar3 < 1000) {
    pbVar7 = (byte *)(pcVar6 + 2);
    if (99 < uVar3) goto LAB_00136bda;
    if (9 < uVar3) goto LAB_00136bf2;
  }
  else {
    pcVar6[2] = '1';
    pbVar7 = (byte *)(pcVar6 + 3);
LAB_00136bda:
    *pbVar7 = (byte)(((ulong)uVar3 / 100) % 10) | 0x30;
    pbVar7 = pbVar7 + 1;
LAB_00136bf2:
    *pbVar7 = (byte)(((ulong)uVar3 / 10) % 10) | 0x30;
    pbVar7 = pbVar7 + 1;
  }
  *pbVar7 = (byte)((ulong)uVar3 % 10) | 0x30;
  pbVar7 = pbVar7 + 1;
LAB_00136c18:
  __n = size - 1;
  if ((ulong)((long)pbVar7 - (long)buffer_1) < size) {
    __n = (long)pbVar7 - (long)buffer_1;
  }
  memcpy(buffer,buffer_1,__n);
  buffer[__n] = '\0';
  return;
}

Assistant:

void WriteDoubleHex(char* buffer, size_t size, uint64_t bits) {
  return FloatWriter<double>::WriteHex(buffer, size, bits);
}